

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O0

void test_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ushort **ppuVar5;
  long in_RDX;
  double dVar6;
  char *p;
  int hdunum;
  int nexlnkey;
  char *exlnkey [4];
  int nexlkey;
  char *exlkey [3];
  int numusrkey;
  int n;
  int k;
  int j;
  int i;
  FitsKey **kwds;
  FitsKey *pkey;
  FitsKey *in_stack_ffffffffffffff68;
  uint uVar7;
  int iVar8;
  FILE *out_00;
  char *pcVar9;
  char *mkey;
  char *ikey;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar10;
  char *pcVar11;
  char **strs;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  
  pcVar11 = "SIMPLE";
  strs = (char **)0x289ec5;
  iVar10 = 3;
  out_00 = (FILE *)0x28940f;
  pcVar9 = "PSCAL";
  mkey = "PZERO";
  ikey = "GROUPS";
  iVar8 = 4;
  lVar1 = *(long *)(in_RDX + 0xa8);
  uVar7 = *(uint *)(in_RDX + 4);
  local_2c = uVar7;
  while (local_2c = local_2c - 1, 0 < (int)local_2c) {
    iVar3 = test_hduname((int)pcVar9,(int)((ulong)out_00 >> 0x20));
    if (iVar3 != 0) {
      sprintf(comm,"The HDU %d and %d have identical type/name/version",(ulong)uVar7,(ulong)local_2c
             );
      wrtwrn(out_00,(char *)CONCAT44(iVar8,uVar7),(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
  }
  strcpy(temp,"PCOUNT");
  ptemp = temp;
  key_match(strs,(int)((ulong)pcVar11 >> 0x20),(char **)CONCAT44(iVar10,in_stack_ffffffffffffffa0),
            in_stack_ffffffffffffff9c,(int *)ikey,(int *)mkey);
  if (local_34 < 0) {
    sprintf(errmes,"cannot find the PCOUNT keyword.");
    wrterr(out_00,(char *)CONCAT44(iVar8,uVar7),(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  }
  else {
    lVar2 = *(long *)(*(long *)(in_RDX + 0xa8) + (long)local_34 * 8);
    iVar3 = check_int(in_stack_ffffffffffffff68,(FILE *)0x111f4e);
    if (iVar3 != 0) {
      dVar6 = atof((char *)(lVar2 + 0x50));
      *(long *)(in_RDX + 0x18) = (long)dVar6;
    }
    if (*(int *)(lVar2 + 0x98) != *(int *)(in_RDX + 0x24) + 4) {
      sprintf(errmes,"PCOUNT is not in record %d of the header.",
              (ulong)(*(int *)(in_RDX + 0x24) + 4));
      wrterr(out_00,(char *)CONCAT44(iVar8,uVar7),(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
    check_fixed_int((char *)out_00,(FILE *)CONCAT44(iVar8,uVar7));
  }
  strcpy(temp,"GCOUNT");
  ptemp = temp;
  key_match(strs,(int)((ulong)pcVar11 >> 0x20),(char **)CONCAT44(iVar10,in_stack_ffffffffffffffa0),
            in_stack_ffffffffffffff9c,(int *)ikey,(int *)mkey);
  if (local_34 < 0) {
    sprintf(errmes,"cannot find the GCOUNT keyword.");
    wrterr(out_00,(char *)CONCAT44(iVar8,uVar7),(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  }
  else {
    lVar2 = *(long *)(*(long *)(in_RDX + 0xa8) + (long)local_34 * 8);
    iVar3 = check_int(in_stack_ffffffffffffff68,(FILE *)0x1120a4);
    if (iVar3 != 0) {
      lVar4 = strtol((char *)(lVar2 + 0x50),(char **)0x0,10);
      *(int *)(in_RDX + 0x10) = (int)lVar4;
    }
    if (*(int *)(lVar2 + 0x98) != *(int *)(in_RDX + 0x24) + 5) {
      sprintf(errmes,"GCOUNT is not in record %d of the header.",
              (ulong)(*(int *)(in_RDX + 0x24) + 5));
      wrterr(out_00,(char *)CONCAT44(iVar8,uVar7),(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
    check_fixed_int((char *)out_00,(FILE *)CONCAT44(iVar8,uVar7));
  }
  for (local_2c = 0; (int)local_2c < iVar10; local_2c = local_2c + 1) {
    strcpy(temp,*(char **)(&stack0xffffffffffffffa8 + (long)(int)local_2c * 8));
    ptemp = temp;
    key_match(strs,(int)((ulong)pcVar11 >> 0x20),(char **)CONCAT44(iVar10,in_stack_ffffffffffffffa0)
              ,in_stack_ffffffffffffff9c,(int *)ikey,(int *)mkey);
    if (-1 < local_34) {
      lVar2 = *(long *)(*(long *)(in_RDX + 0xa8) + (long)local_34 * 8);
      sprintf(errmes,"Keyword #%d, %s is not allowed in extensions.",(ulong)*(uint *)(lVar2 + 0x98),
              lVar2);
      wrterr(out_00,(char *)CONCAT44(iVar8,uVar7),(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
  }
  for (local_2c = 0; (int)local_2c < iVar8; local_2c = local_2c + 1) {
    strcpy(temp,*(char **)(&stack0xffffffffffffff78 + (long)(int)local_2c * 8));
    ptemp = temp;
    key_match(strs,(int)((ulong)pcVar11 >> 0x20),(char **)CONCAT44(iVar10,in_stack_ffffffffffffffa0)
              ,in_stack_ffffffffffffff9c,(int *)ikey,(int *)mkey);
    if (-1 < local_34) {
      for (local_30 = local_34; local_30 < local_34 + local_38; local_30 = local_30 + 1) {
        pcVar9 = (char *)(*(long *)(lVar1 + (long)local_30 * 8) + 5);
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)*pcVar9] & 0x800) != 0) {
          lVar2 = *(long *)(*(long *)(in_RDX + 0xa8) + (long)local_30 * 8);
          sprintf(errmes,"Keyword #%d, %s is only allowed in Random Groups structures.",
                  (ulong)*(uint *)(lVar2 + 0x98),lVar2);
          wrterr(out_00,(char *)CONCAT44(iVar8,uVar7),(int)((ulong)pcVar9 >> 0x20));
        }
      }
    }
  }
  return;
}

Assistant:

void test_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            ) 
{
    FitsKey *pkey;
    FitsKey **kwds;
    int  i,j,k,n;
    int numusrkey;
    char *exlkey[] = {"SIMPLE","EXTEND", "BLOCKED", }; 
    int nexlkey = 3;
    char *exlnkey[] = {"PTYPE","PSCAL", "PZERO", "GROUPS", }; 
    int nexlnkey = 4;
    int hdunum;
    char *p;

    numusrkey = hduptr->tkeys;
    kwds = hduptr->kwds;
    hdunum = hduptr->hdunum;

    /* check the duplicate extensions */
    for (i = hdunum - 1; i > 0; i--) { 
        if(test_hduname(hdunum,i)) { 
            sprintf(comm, 
	    "The HDU %d and %d have identical type/name/version", 
                hdunum,i);
            wrtwrn(out,comm,0);
        }
    }

    /* check the position of the PCOUNT  */
    strcpy(temp,"PCOUNT");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n); 
    if( k < 0) { 
	sprintf(errmes,"cannot find the PCOUNT keyword.");
        wrterr(out,errmes,1);
    } 
    else {
        pkey = hduptr->kwds[k]; 
	if(check_int(pkey,out)) 
	    hduptr->pcount = (LONGLONG) atof(pkey->kvalue);
        if( pkey->kindex != 4 + hduptr->naxis ) {
	     sprintf(errmes,"PCOUNT is not in record %d of the header.",
                 hduptr->naxis + 4); 
             wrterr(out,errmes,1);
        } 

        check_fixed_int(cards[pkey->kindex - 1], out);
    }

    /* check the position of the GCOUNT */
    strcpy(temp,"GCOUNT");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n); 
    if( k < 0) { 
	sprintf(errmes,"cannot find the GCOUNT keyword.");
        wrterr(out,errmes,1);
    } 
    else {
        pkey = hduptr->kwds[k]; 
	if(check_int(pkey,out)) 
	    hduptr->gcount = (int) strtol(pkey->kvalue,NULL,10);
        if( pkey->kindex != 5 + hduptr->naxis ) {
	     sprintf(errmes,"GCOUNT is not in record %d of the header.",
                 hduptr->naxis + 5); 
             wrterr(out,errmes,1);
        } 

        check_fixed_int(cards[pkey->kindex - 1], out);
    }

    for (i = 0; i < nexlkey; i++) {
        strcpy(temp,exlkey[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n);  
    	if(k > -1) {
            pkey = hduptr->kwds[k];
            sprintf( errmes, 
               "Keyword #%d, %s is not allowed in extensions.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
        } 
    }

    for (i = 0; i < nexlnkey; i++) {
        strcpy(temp,exlnkey[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    	if(k > -1) {

          for (j = k; j< k + n ; j++){ 
	    p = kwds[j]->kname; 
	    p += 5;
            if(!isdigit((int)*p)) continue;

            pkey = hduptr->kwds[j];
            sprintf( errmes, 
               "Keyword #%d, %s is only allowed in Random Groups structures.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
          }
        } 
    }

    return;

}